

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

void __thiscall
IlmThread_2_5::anon_unknown_5::DefaultThreadPoolProvider::addTask
          (DefaultThreadPoolProvider *this,Task *task)

{
  Lock local_28;
  Task *local_18;
  
  local_18 = task;
  if (((this->_data).hasThreads._M_base._M_i & 1U) != 0) {
    local_28._mutex = &(this->_data).taskMutex;
    std::mutex::lock(local_28._mutex);
    local_28._locked = true;
    std::vector<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>::push_back
              (&(this->_data).tasks,&local_18);
    Lock::~Lock(&local_28);
    Semaphore::post(&(this->_data).taskSemaphore);
    return;
  }
  (*task->_vptr_Task[2])(task);
  TaskGroup::Data::removeTask(task->_group->_data);
  (*task->_vptr_Task[1])(task);
  return;
}

Assistant:

void
DefaultThreadPoolProvider::addTask (Task *task)
{
    //
    // Lock the threads, needed to access numThreads
    //
#ifdef ILMBASE_FORCE_CXX03
    bool doPush;
    {
        Lock lock (_data.threadMutex);
        doPush = !_data.threads.empty();
    }
#else
    bool doPush = _data.hasThreads.load( std::memory_order_relaxed );
#endif

    if ( doPush )
    {
        //
        // Get exclusive access to the tasks queue
        //

        {
            Lock taskLock (_data.taskMutex);

            //
            // Push the new task into the FIFO
            //
            _data.tasks.push_back (task);
        }
        
        //
        // Signal that we have a new task to process
        //
        _data.taskSemaphore.post ();
    }
    else
    {
        // this path shouldn't normally happen since we have the
        // NullThreadPoolProvider, but just in case...
        task->execute ();
        task->group()->_data->removeTask ();
        delete task;
    }
}